

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

sunrealtype N_VWL2Norm_ManyVector(N_Vector x,N_Vector w)

{
  sunrealtype __x;
  double dVar1;
  sunrealtype sVar2;
  
  __x = N_VWSqrSumLocal_ManyVector(x,w);
  sVar2 = 0.0;
  if (0.0 < __x) {
    if (__x < 0.0) {
      dVar1 = sqrt(__x);
      return dVar1;
    }
    sVar2 = SQRT(__x);
  }
  return sVar2;
}

Assistant:

sunrealtype MVAPPEND(N_VWL2Norm)(N_Vector x, N_Vector w)
{
  SUNFunctionBegin(x->sunctx);
  sunrealtype gsum;
#ifdef MANYVECTOR_BUILD_WITH_MPI
  sunrealtype lsum;
  lsum = gsum = N_VWSqrSumLocal_MPIManyVector(x, w);
  SUNCheckLastErrNoRet();
  if (MANYVECTOR_COMM(x) != MPI_COMM_NULL)
  {
    SUNCheckMPICallNoRet(MPI_Allreduce(&lsum, &gsum, 1, MPI_SUNREALTYPE,
                                       MPI_SUM, MANYVECTOR_COMM(x)));
  }
#else
  gsum = N_VWSqrSumLocal_ManyVector(x, w);
  SUNCheckLastErrNoRet();
#endif
  return (SUNRsqrt(gsum));
}